

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O1

long __thiscall
text_subtitles::TextToPGSConverter::composeObjectDefinition
          (TextToPGSConverter *this,uint8_t *buff,int64_t pts,int64_t dts,int firstLine,int lastLine
          ,bool needPgHeader)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> seqPos;
  uint8_t *local_90;
  uchar **local_88;
  iterator iStack_80;
  uchar **local_78;
  uint local_64;
  uint8_t *local_60;
  uint8_t *local_58;
  int64_t local_50;
  int64_t local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_88 = (uchar **)0x0;
  iStack_80._M_current = (uchar **)0x0;
  local_78 = (uchar **)0x0;
  local_40 = this->m_renderedData;
  local_64 = (lastLine - firstLine) + 1U & 0xffff;
  iVar4 = 0;
  iVar5 = 0;
  local_90 = buff;
  local_60 = buff;
  local_58 = buff;
  local_50 = pts;
  local_48 = dts;
  do {
    if (needPgHeader) {
      writePGHeader(local_90,local_50,local_48);
      local_90 = local_90 + 10;
    }
    puVar1 = local_90 + 1;
    *local_90 = '\x15';
    local_90[3] = '\0';
    puVar2 = local_90 + 5;
    local_90[4] = '\0';
    local_90 = local_90 + 6;
    *puVar2 = '\0';
    if (iStack_80._M_current == local_78) {
      std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
      _M_realloc_insert<unsigned_char*const&>
                ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)&local_88,iStack_80,
                 &local_90);
    }
    else {
      *iStack_80._M_current = local_90;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
    puVar2 = local_90 + 1;
    *local_90 = '\0';
    iVar3 = 0xffeb;
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar7) {
      local_90 = local_90 + 4;
      local_60 = puVar2;
      AV_WB16(local_90,this->m_videoWidth);
      local_90 = local_90 + 2;
      AV_WB16(local_90,(uint16_t)local_64);
      iVar3 = 0xffe4;
      puVar2 = local_90 + 2;
    }
    local_90 = puVar2;
    iVar6 = this->m_rleLen - iVar5;
    if (iVar3 <= iVar6) {
      iVar6 = iVar3;
    }
    local_38 = puVar1;
    memcpy(local_90,local_40 + iVar5,(long)iVar6);
    local_90 = local_90 + iVar6;
    AV_WB16(local_38,(short)local_90 - ((short)puVar1 + 2));
    iVar5 = iVar5 + iVar6;
  } while (iVar5 < this->m_rleLen);
  AV_WB24(local_60,this->m_rleLen + 4);
  puVar1 = local_90;
  if (local_88 != iStack_80._M_current) {
    **local_88 = **local_88 | 0x80;
    *iStack_80._M_current[-1] = *iStack_80._M_current[-1] | 0x40;
  }
  if (local_88 != (uchar **)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return (long)puVar1 - (long)local_58;
}

Assistant:

long TextToPGSConverter::composeObjectDefinition(uint8_t* buff, const int64_t pts, const int64_t dts,
                                                 const int firstLine, const int lastLine, const bool needPgHeader) const
{
    std::vector<uint8_t*> seqPos;

    const uint8_t* srcData = m_renderedData;
    int srcProcessed = 0;
    int blocks = 0;
    uint8_t* curPos = buff;
    uint8_t* sizePos = buff;
    do
    {
        if (needPgHeader)
            curPos += writePGHeader(curPos, pts, dts);
        *curPos++ = OBJECT_DEF_SEGMENT;
        curPos += 2;  // skip length field
        uint8_t* fragmentStart = curPos;
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // objectID
        *curPos++ = 0;  // object version number
        seqPos.push_back(curPos);
        *curPos++ = 0;  // 0xc0; // sequence descriptor: first=true, last=true

        if (blocks == 0)
        {
            sizePos = curPos;
            // object data header
            curPos += 3;  // skip total size
            AV_WB16(curPos, m_videoWidth);
            curPos += 2;
            AV_WB16(curPos, static_cast<uint16_t>(lastLine - firstLine + 1));
            curPos += 2;
        }

        int MAX_PG_PACKET = 65515;
        if (blocks == 0)
            MAX_PG_PACKET -= 7;
        const int size = FFMIN(m_rleLen - srcProcessed, MAX_PG_PACKET);
        memcpy(curPos, srcData + srcProcessed, size);
        srcProcessed += size;
        curPos += size;

        AV_WB16(fragmentStart - 2, static_cast<uint16_t>(curPos - fragmentStart));  // correct length field
        blocks++;
    } while (srcProcessed < m_rleLen);
    AV_WB24(sizePos, m_rleLen + 4);  // object len
    if (!seqPos.empty())
    {
        *(seqPos[0]) |= 0x80;
        *(seqPos[seqPos.size() - 1]) |= 0x40;
    }
    return static_cast<long>(curPos - buff);
}